

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O1

MPP_RET avs2d_dpb_insert(Avs2dCtx_t *p_dec,HalDecTask *task)

{
  Avs2dFrameMgr_t *mgr;
  RK_S32 *pRVar1;
  RK_U8 *pRVar2;
  RK_U8 RVar3;
  byte bVar4;
  uint uVar5;
  Avs2dPicType AVar6;
  Avs2dFrame_t **ppAVar7;
  MppFrame s;
  Avs2dFrame_t *pAVar8;
  bool bVar9;
  int iVar10;
  MppFrameFormat MVar11;
  MPP_RET MVar12;
  RK_S32 RVar13;
  RK_S64 RVar14;
  Avs2dFrame_t *pAVar15;
  int iVar16;
  char *fname;
  long lVar17;
  ulong uVar18;
  char *fmt;
  RK_U32 RVar19;
  uint uVar20;
  ulong uVar21;
  undefined8 uVar22;
  Avs2dFrame_t *pAVar23;
  uint uVar24;
  bool bVar25;
  
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","avs2d_dpb_insert");
  }
  mgr = &p_dec->frm_mgr;
  if ((p_dec->frm_mgr).output_poi != -1) {
    iVar10 = (p_dec->frm_mgr).prev_doi;
    uVar24 = iVar10 + 0x100;
    if (-1 < (int)(iVar10 + 1U)) {
      uVar24 = iVar10 + 1U;
    }
    if ((p_dec->ph).doi != (iVar10 - (uVar24 & 0xffffff00)) + 1) {
      if (((byte)avs2d_parse_debug & 4) != 0) {
        _mpp_log_l(4,"avs2d_dpb","discontinuous DOI (prev: %d --> curr: %d).",(char *)0x0);
      }
      uVar24 = mgr->dpb_size;
      if ((ulong)uVar24 != 0) {
        ppAVar7 = (p_dec->frm_mgr).dpb;
        uVar18 = 0;
        do {
          pAVar23 = ppAVar7[uVar18];
          if (pAVar23->slot_idx != -1) {
            uVar5 = pAVar23->doi;
            uVar20 = uVar5 + 0xff;
            if (-1 < (int)uVar5) {
              uVar20 = uVar5;
            }
            uVar20 = ((uVar20 & 0xffffff00) - uVar5) + (p_dec->ph).doi;
            uVar5 = -uVar20;
            if (0 < (int)uVar20) {
              uVar5 = uVar20;
            }
            if (1 < uVar5) {
              pAVar23->refered_by_others = '\0';
              pAVar23->refered_by_scene = '\0';
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar24 != uVar18);
      }
    }
  }
  iVar10 = (p_dec->ph).doi;
  if (iVar10 < (p_dec->frm_mgr).prev_doi) {
    pRVar1 = &(p_dec->frm_mgr).tr_wrap_cnt;
    *pRVar1 = *pRVar1 + 1;
  }
  (p_dec->frm_mgr).prev_doi = iVar10;
  iVar16 = (p_dec->frm_mgr).tr_wrap_cnt * 0x100;
  iVar10 = iVar10 + iVar16;
  (p_dec->ph).doi = iVar10;
  if (0x7ffffdfe < iVar10) {
    iVar16 = iVar16 + -0x100;
    uVar24 = mgr->dpb_size;
    if ((ulong)uVar24 != 0) {
      ppAVar7 = (p_dec->frm_mgr).dpb;
      uVar18 = 0;
      do {
        pAVar23 = ppAVar7[uVar18];
        if (pAVar23->slot_idx != -1) {
          pAVar23->doi = pAVar23->doi - iVar16;
          pAVar23->poi = pAVar23->poi - iVar16;
        }
        uVar18 = uVar18 + 1;
      } while (uVar24 != uVar18);
    }
    (p_dec->ph).doi = iVar10 - iVar16;
    iVar10 = (p_dec->frm_mgr).output_poi;
    if (iVar10 != -1) {
      (p_dec->frm_mgr).output_poi = iVar10 - iVar16;
    }
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","low_delay %d, reorder_delay %d\n","compute_frame_order_index",
               (ulong)(p_dec->vsh).low_delay,(ulong)(p_dec->vsh).picture_reorder_delay);
  }
  iVar10 = (p_dec->ph).doi;
  if ((p_dec->vsh).low_delay == '\0') {
    iVar10 = (iVar10 + (uint)(p_dec->ph).picture_output_delay) -
             (uint)(p_dec->vsh).picture_reorder_delay;
  }
  (p_dec->ph).poi = iVar10;
  if ((((p_dec->ph).doi < 0) || ((p_dec->ph).poi < 0)) &&
     (_mpp_log_l(2,"avs2d_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "ph->doi >= 0 && ph->poi >= 0","compute_frame_order_index",0xf4),
     (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_00187b63;
  if (((p_dec->frm_mgr).output_poi == -1) && ((p_dec->ph).picture_type == I_PICTURE)) {
    (p_dec->frm_mgr).output_poi = (p_dec->ph).poi;
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","picuture DOI %d, POI %d, out_delay %d, output_poi %d\n",
               "compute_frame_order_index",(ulong)(uint)(p_dec->ph).doi,(ulong)(uint)(p_dec->ph).poi
               ,(ulong)(p_dec->ph).picture_output_delay,(ulong)(uint)(p_dec->frm_mgr).output_poi);
  }
  dpb_output_next_frame(p_dec,1);
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_remove_scene_frame");
  }
  if ((((p_dec->ph).picture_type & ~P_PICTURE) == G_PICTURE) &&
     (pAVar23 = (p_dec->frm_mgr).scene_ref, pAVar23 != (Avs2dFrame_t *)0x0)) {
    pAVar23->refered_by_scene = '\0';
    if (pAVar23->picture_type == GB_PICTURE) {
      dpb_remove_frame(p_dec,pAVar23);
    }
    (p_dec->frm_mgr).scene_ref = (Avs2dFrame_t *)0x0;
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","dpb_remove_scene_frame");
  }
  dpb_remove_unused_frame(p_dec);
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_alloc_frame");
  }
  if (((p_dec->vsh).field_coded_sequence == '\0') || ((ulong)mgr->dpb_size == 0)) {
    pAVar23 = (Avs2dFrame_t *)0x0;
  }
  else {
    uVar18 = 0;
    do {
      pAVar23 = (p_dec->frm_mgr).dpb[uVar18];
      if ((pAVar23->slot_idx != -1) && (pAVar23->poi == (p_dec->ph).poi)) goto LAB_0018710a;
      uVar18 = uVar18 + 1;
    } while (mgr->dpb_size != uVar18);
  }
  if ((ulong)mgr->dpb_size != 0) {
    lVar17 = 0;
    do {
      pAVar23 = (p_dec->frm_mgr).dpb[lVar17];
      if (pAVar23->slot_idx == -1) break;
      bVar25 = (ulong)mgr->dpb_size - 1 != lVar17;
      lVar17 = lVar17 + 1;
    } while (bVar25);
  }
LAB_0018710a:
  if (pAVar23 == (Avs2dFrame_t *)0x0) {
    fmt = "Failed to get dpb buffer.\n";
    pAVar23 = (Avs2dFrame_t *)0x0;
    iVar10 = 2;
    fname = (char *)0x0;
LAB_0018752c:
    _mpp_log_l(iVar10,"avs2d_dpb",fmt,fname);
  }
  else {
    pAVar23->doi = (p_dec->ph).doi;
    pAVar23->poi = (p_dec->ph).poi;
    pAVar23->out_delay = (uint)(p_dec->ph).picture_output_delay;
    AVar6 = (p_dec->ph).picture_type;
    bVar25 = AVar6 == G_PICTURE || AVar6 == GB_PICTURE;
    s = pAVar23->frame;
    pAVar23->picture_type = AVar6;
    pAVar23->invisible = AVar6 == GB_PICTURE;
    pAVar23->scene_frame_flag = bVar25;
    pAVar23->intra_frame_flag = AVar6 == I_PICTURE || (AVar6 & ~P_PICTURE) == G_PICTURE;
    pAVar23->refered_by_scene = bVar25;
    if (AVar6 == GB_PICTURE) {
      bVar25 = false;
    }
    else {
      bVar25 = (p_dec->frm_mgr).cur_rps.refered_by_others != '\0';
    }
    pAVar23->refered_by_others = bVar25;
    if (((byte)avs2d_parse_debug & 0x40) != 0) {
      _mpp_log_l(4,"avs2d_dpb","frame picture type %d, ref by others %d\n","dpb_alloc_frame",
                 (ulong)AVar6,(ulong)bVar25);
    }
    if ((p_dec->vsh).chroma_format == '\x01') {
      RVar3 = (p_dec->vsh).bit_depth;
      if (RVar3 == '\b') {
        MVar11 = MPP_FMT_YUV420SP;
      }
      else {
        if (RVar3 != '\n') goto LAB_00187202;
        MVar11 = MPP_FMT_YUV420SP_10BIT;
      }
      mpp_frame_set_fmt(s,MVar11);
    }
LAB_00187202:
    MVar11 = (((p_dec->init).cfg)->base).out_fmt;
    if ((MVar11 & 0xf00000) == MPP_FMT_YUV420SP) {
      if ((MVar11 >> 0x19 & 1) != 0) {
        MVar11 = mpp_frame_get_fmt(s);
        mpp_frame_set_fmt(s,(((p_dec->init).cfg)->base).out_fmt & 0x2000000 | MVar11);
      }
    }
    else {
      RVar19 = (p_dec->vsh).horizontal_size;
      MVar11 = mpp_frame_get_fmt(s);
      mpp_frame_set_fmt(s,(((p_dec->init).cfg)->base).out_fmt & 0xf00000 | MVar11);
      if (*compat_ext_fbc_hdr_256_odd == 0) {
        RVar19 = RVar19 + 0x3f & 0xffffffc0;
      }
      else {
        RVar19 = (p_dec->vsh).horizontal_size + 0xff & 0xfffffe00 | 0x100;
      }
      mpp_frame_set_fbc_hdr_stride(s,RVar19);
      mpp_frame_set_offset_y(s,8);
    }
    if (p_dec->is_hdr != 0) {
      MVar11 = mpp_frame_get_fmt(s);
      mpp_frame_set_fmt(s,MVar11 | 0x4000000);
    }
    RVar19 = (((p_dec->init).cfg)->base).enable_thumbnail;
    if ((RVar19 == 0) || ((((p_dec->init).hw_info)->field_0x6 & 8) == 0)) {
      RVar19 = 0;
    }
    mpp_frame_set_thumbnail_en(s,RVar19);
    mpp_frame_set_width(s,(p_dec->vsh).horizontal_size);
    mpp_frame_set_height(s,(p_dec->vsh).vertical_size);
    RVar14 = mpp_packet_get_pts(task->input_packet);
    mpp_frame_set_pts(s,RVar14);
    RVar14 = mpp_packet_get_dts(task->input_packet);
    mpp_frame_set_dts(s,RVar14);
    mpp_frame_set_errinfo(s,0);
    mpp_frame_set_discard(s,0);
    mpp_frame_set_poc(s,pAVar23->poi);
    if (p_dec->got_exh != 0) {
      mpp_frame_set_color_primaries(s,(p_dec->exh).color_primaries);
      mpp_frame_set_color_trc(s,(p_dec->exh).transfer_characteristics);
      mpp_frame_set_colorspace(s,(p_dec->exh).matrix_coefficients);
    }
    mpp_frame_set_content_light(s,p_dec->content_light);
    mpp_frame_set_mastering_display(s,p_dec->display_meta);
    if ((p_dec->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0) && (p_dec->hdr_dynamic != 0)) {
      mpp_frame_set_hdr_dynamic_meta(s,p_dec->hdr_dynamic_meta);
      p_dec->hdr_dynamic = 0;
    }
    if ((p_dec->vsh).progressive_sequence == '\0') {
      pAVar23->frame_mode = 3;
      if ((p_dec->vsh).field_coded_sequence == '\0') {
        pAVar23->frame_coding_mode = 0;
        if ((p_dec->ph).top_field_first == '\0') {
          pAVar23->frame_mode = 0xb;
        }
        else {
          pAVar23->frame_mode = 7;
        }
      }
      else {
        pAVar23->frame_coding_mode = 3;
        if ((p_dec->ph).top_field_first == '\0') {
          uVar22 = 0xb0000000b;
        }
        else {
          uVar22 = 0x700000007;
        }
        pAVar23->frame_mode = (int)uVar22;
        pAVar23->frame_coding_mode = (int)((ulong)uVar22 >> 0x20);
      }
    }
    else {
      pAVar23->frame_mode = 0;
      pAVar23->frame_coding_mode = 0;
      if (((((p_dec->init).cfg)->base).enable_vproc & 2) != 0) {
        pAVar23->frame_mode = 0xc;
      }
    }
    mpp_frame_set_mode(s,pAVar23->frame_mode);
    MVar12 = mpp_buf_slot_get_unused(p_dec->frame_slots,&pAVar23->slot_idx);
    if ((MVar12 != MPP_OK) &&
       (_mpp_log_l(2,"avs2d_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                   "dpb_alloc_frame",0x23b), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00187b63:
      abort();
    }
    (p_dec->frm_mgr).used_size = (p_dec->frm_mgr).used_size + 1;
    if (((byte)avs2d_parse_debug & 0x40) != 0) {
      _mpp_log_l(4,"avs2d_dpb","get unused buf slot %d, DPB used %d \n","dpb_alloc_frame",
                 (ulong)(uint)pAVar23->slot_idx);
    }
    if (((byte)avs2d_parse_debug & 0x40) != 0) {
      fmt = "Out.";
      fname = "dpb_alloc_frame";
      iVar10 = 4;
      goto LAB_0018752c;
    }
  }
  p_dec->frame_no = p_dec->frame_no + 1;
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","get unused frame from dpb %d","avs2d_dpb_insert",
               (ulong)(uint)pAVar23->slot_idx);
  }
  if (pAVar23 == (Avs2dFrame_t *)0x0) {
    _mpp_log_l(2,"avs2d_dpb","Failed to alloc dpb frame.\n",(char *)0x0);
    MVar12 = MPP_ERR_NOMEM;
    goto LAB_00187b2b;
  }
  (p_dec->frm_mgr).cur_frm = pAVar23;
  mpp_buf_slot_set_prop(p_dec->frame_slots,pAVar23->slot_idx,SLOT_FRAME,pAVar23->frame);
  mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar23->slot_idx,SLOT_CODEC_USE);
  mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar23->slot_idx,SLOT_HAL_OUTPUT);
  task->output = ((p_dec->frm_mgr).cur_frm)->slot_idx;
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","curframe slot_idx %d\n","avs2d_dpb_insert");
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_set_frame_refs");
  }
  (p_dec->frm_mgr).refs[4] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[5] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[2] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[3] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[0] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[1] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[6] = (Avs2dFrame_t *)0x0;
  pAVar23 = (p_dec->frm_mgr).cur_frm;
  (p_dec->frm_mgr).num_of_ref = '\0';
  uVar18 = (ulong)(p_dec->frm_mgr).cur_rps.num_of_ref;
  (task->flags).val = (task->flags).val & 0xffffffffff0000ff;
  if (uVar18 != 0) {
    uVar21 = 0;
    do {
      uVar24 = pAVar23->doi - (uint)(p_dec->frm_mgr).cur_rps.ref_pic[uVar21];
      pAVar15 = find_ref_frame(mgr,uVar24);
      if (pAVar15 == (Avs2dFrame_t *)0x0) {
        (task->flags).val =
             (task->flags).val & 0xffffffffff0000ff |
             (ulong)((0x100 << ((byte)uVar21 & 0x1f) | (uint)(task->flags).val) & 0xffff00);
        if (((byte)avs2d_parse_debug & 0x40) != 0) {
          _mpp_log_l(4,"avs2d_dpb","Missing ref doi %d","dpb_set_frame_refs",(ulong)uVar24);
        }
      }
      else {
        (p_dec->frm_mgr).refs[(p_dec->frm_mgr).num_of_ref] = pAVar15;
        mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar15->slot_idx,SLOT_CODEC_USE);
        mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar15->slot_idx,SLOT_HAL_INPUT);
      }
      pRVar2 = &(p_dec->frm_mgr).num_of_ref;
      *pRVar2 = *pRVar2 + '\x01';
      uVar21 = uVar21 + 1;
    } while (uVar18 != uVar21);
  }
  bVar4 = (p_dec->frm_mgr).num_of_ref;
  if ((bVar4 == 0) && (pAVar23->intra_frame_flag == '\0')) {
    bVar25 = true;
    bVar9 = false;
  }
  else {
    AVar6 = pAVar23->picture_type;
    bVar25 = true;
    if (AVar6 - P_PICTURE < 6) {
      ppAVar7 = (p_dec->frm_mgr).refs;
      switch(AVar6) {
      default:
        if ((p_dec->ph).background_reference_flag == '\0') {
          if (AVar6 == B_PICTURE) goto switchD_00187766_caseD_2;
        }
        else {
          pAVar23->refered_bg_frame = '\x01';
          if ((p_dec->frm_mgr).scene_ref == (Avs2dFrame_t *)0x0) goto LAB_00187834;
          (p_dec->syntax).refp.scene_ref_replace_pos = bVar4 - 1;
LAB_00187872:
          bVar25 = false;
        }
        break;
      case B_PICTURE:
switchD_00187766_caseD_2:
        if (((bVar4 != 2) ||
            ((pAVar15 = *ppAVar7, pAVar15 != (Avs2dFrame_t *)0x0 && (pAVar15->poi <= pAVar23->poi)))
            ) || ((pAVar15 = (p_dec->frm_mgr).refs[1], pAVar15 != (Avs2dFrame_t *)0x0 &&
                  (pAVar23->poi <= pAVar15->poi)))) {
LAB_00187834:
          bVar9 = false;
          goto LAB_00187877;
        }
        break;
      case G_PICTURE:
      case GB_PICTURE:
        break;
      case S_PICTURE:
        pAVar23->refered_bg_frame = '\x01';
        pAVar15 = (p_dec->frm_mgr).scene_ref;
        if (pAVar15 == (Avs2dFrame_t *)0x0) goto LAB_00187834;
        pAVar8 = *ppAVar7;
        if (1 < bVar4 || pAVar15 != pAVar8) {
          if (((byte)avs2d_parse_debug & 1) != 0) {
            if (pAVar8 == (Avs2dFrame_t *)0x0) {
              uVar18 = 0xffffffff;
            }
            else {
              uVar18 = (ulong)(uint)pAVar8->doi;
            }
            _mpp_log_l(4,"avs2d_dpb","Error reference frame(doi %ld ~ %ld) for S.\n",(char *)0x0,
                       (ulong)(uint)pAVar15->doi,uVar18);
          }
          (p_dec->syntax).refp.scene_ref_replace_pos = 0;
          goto LAB_00187872;
        }
      }
    }
    bVar9 = true;
  }
LAB_00187877:
  uVar22 = 0;
  lVar17 = 0xc1c;
  if (bVar25) {
    RVar13 = 0;
  }
  else {
    pAVar15 = (p_dec->frm_mgr).scene_ref;
    RVar13 = 0;
    if (pAVar15 != (Avs2dFrame_t *)0x0) {
      (p_dec->syntax).refp.scene_ref_enable = 1;
      RVar13 = pAVar15->slot_idx;
      lVar17 = 0xc18;
    }
  }
  *(RK_S32 *)((long)&p_dec->frame_slots + lVar17) = RVar13;
  if (!bVar9) {
    mpp_frame_set_errinfo(pAVar23->frame,1);
    uVar22 = 0xffffffff;
    if (((byte)avs2d_parse_debug & 1) != 0) {
      _mpp_log_l(4,"avs2d_dpb","Error reference frame for picture(%d).\n",(char *)0x0,
                 (ulong)pAVar23->picture_type);
    }
  }
  MVar12 = (MPP_RET)uVar22;
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out. ret %d","dpb_set_frame_refs",uVar22);
  }
  if (!bVar9) {
    *(byte *)&task->flags = *(byte *)&task->flags & 0xf7;
  }
  if ((p_dec->frm_mgr).num_of_ref != '\0') {
    uVar18 = 0;
    do {
      pAVar23 = (p_dec->frm_mgr).refs[uVar18];
      if (pAVar23 == (Avs2dFrame_t *)0x0) {
        RVar13 = -1;
      }
      else {
        RVar13 = pAVar23->slot_idx;
      }
      task->refer[uVar18] = RVar13;
      if (pAVar23 == (Avs2dFrame_t *)0x0) {
        task->refer[uVar18] = -1;
        if (((byte)avs2d_parse_debug & 0x40) != 0) {
          _mpp_log_l(4,"avs2d_dpb","task refer[%d] missing ref\n","avs2d_dpb_insert",
                     uVar18 & 0xffffffff);
        }
      }
      else {
        uVar24 = pAVar23->slot_idx;
        task->refer[uVar18] = uVar24;
        if (((byte)avs2d_parse_debug & 0x40) != 0) {
          _mpp_log_l(4,"avs2d_dpb","task refer[%d] slot_idx %d doi %d poi %d","avs2d_dpb_insert",
                     uVar18 & 0xffffffff,(ulong)uVar24,(ulong)(uint)pAVar23->doi,
                     (ulong)(uint)pAVar23->poi);
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (p_dec->frm_mgr).num_of_ref);
  }
  dpb_update_refs(p_dec);
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","--------DPB INFO--------","avs2d_dpb_insert");
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","dpb_idx slt_idx doi poi type out refered\n","avs2d_dpb_insert");
  }
  if (mgr->dpb_size != 0) {
    uVar18 = 0;
    do {
      if (((byte)avs2d_parse_debug & 0x40) != 0) {
        pAVar23 = (p_dec->frm_mgr).dpb[uVar18];
        AVar6 = pAVar23->picture_type;
        if ((ulong)AVar6 < 6) {
          uVar21 = (ulong)*(uint *)(&DAT_002862b0 + (ulong)AVar6 * 4);
        }
        else {
          uVar21 = 0x45;
          if (AVar6 == S_PICTURE) {
            uVar21 = 0x53;
          }
        }
        _mpp_log_l(4,"avs2d_dpb","%02d      %02d      %02d  %02d  %c    %d   %d","avs2d_dpb_insert",
                   uVar18 & 0xffffffff,(ulong)(uint)pAVar23->slot_idx,(ulong)(uint)pAVar23->doi,
                   (ulong)(uint)pAVar23->poi,uVar21,(ulong)pAVar23->is_output,
                   (ulong)(pAVar23->refered_by_scene | pAVar23->refered_by_others));
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < mgr->dpb_size);
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","------------------------","avs2d_dpb_insert");
  }
LAB_00187b2b:
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","avs2d_dpb_insert");
  }
  return MVar12;
}

Assistant:

MPP_RET avs2d_dpb_insert(Avs2dCtx_t *p_dec, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    Avs2dFrame_t *p;
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;

    AVS2D_PARSE_TRACE("In.");

    compute_frame_order_index(p_dec);

    //!< output frame from dpb
    dpb_output_next_frame(p_dec, 1);

    //!< remove scene(G/GB) frame(scene dbp has only one G/GB)
    dpb_remove_scene_frame(p_dec);

    //!< remove unused dpb frame
    dpb_remove_unused_frame(p_dec);

    //!< set task with new frame
    p = dpb_alloc_frame(p_dec, task);
    p_dec->frame_no++;
    avs2d_dbg_dpb("get unused frame from dpb %d", p->slot_idx);
    if (!p) {
        ret = MPP_ERR_NOMEM;
        mpp_err("Failed to alloc dpb frame.\n");
        goto __FAILED;
    }

    mgr->cur_frm = p;
    mpp_buf_slot_set_prop(p_dec->frame_slots, p->slot_idx, SLOT_FRAME, p->frame);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p->slot_idx, SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p->slot_idx, SLOT_HAL_OUTPUT);

    //!< set task output
    task->output = mgr->cur_frm->slot_idx;
    avs2d_dbg_dpb("curframe slot_idx %d\n", mgr->cur_frm->slot_idx);

    //!< set task refers
    ret = dpb_set_frame_refs(p_dec, mgr, task);
    if (ret)
        task->flags.ref_err = 0;

    for (i = 0; i < mgr->num_of_ref; i++) {
        task->refer[i] = mgr->refs[i] ? mgr->refs[i]->slot_idx : -1;
        if (mgr->refs[i]) {
            task->refer[i] = mgr->refs[i]->slot_idx;
            avs2d_dbg_dpb("task refer[%d] slot_idx %d doi %d poi %d", i, task->refer[i], mgr->refs[i]->doi, mgr->refs[i]->poi);
        } else {
            task->refer[i] = -1;
            avs2d_dbg_dpb("task refer[%d] missing ref\n", i);
        }
    }

    //!< update dpb by rps
    dpb_update_refs(p_dec);

    avs2d_dbg_dpb("--------DPB INFO--------");
    avs2d_dbg_dpb("dpb_idx slt_idx doi poi type out refered\n");
    Avs2dFrame_t *tmp;
    for (i = 0; i < mgr->dpb_size; i++) {
        tmp = mgr->dpb[i];
        avs2d_dbg_dpb("%02d      %02d      %02d  %02d  %c    %d   %d",
                      i, tmp->slot_idx, tmp->doi, tmp->poi, PICTURE_TYPE_TO_CHAR(tmp->picture_type),
                      tmp->is_output, tmp->refered_by_others | tmp->refered_by_scene);
    }
    avs2d_dbg_dpb("------------------------");

__FAILED:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}